

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ft_raster_example.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  short sVar1;
  Bitmap *pBVar2;
  short sVar3;
  long lVar4;
  vector<SW_FT_Span_,_std::allocator<SW_FT_Span_>_> *__range1;
  uint uVar5;
  SW_FT_Span_ *span;
  short *psVar6;
  SpanHolder holder;
  shared_ptr<TRM::Bitmap> framebuffer;
  FTOutline outline;
  SW_FT_Raster_Params params;
  short *local_148;
  short *psStack_140;
  long local_138;
  Bitmap *local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  FTOutline local_120;
  short *local_88;
  Color local_7c;
  SW_FT_Raster_Params local_78;
  
  local_120.ft.n_contours = 800;
  local_120.ft.n_points = 0;
  local_78.source = (void *)CONCAT44(local_78.source._4_4_,600);
  local_130 = (Bitmap *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TRM::Bitmap,std::allocator<TRM::Bitmap>,int,int>
            (&local_128,&local_130,(allocator<TRM::Bitmap> *)&local_148,(int *)&local_120,
             (int *)&local_78);
  pBVar2 = local_130;
  TRM::Color::Color((Color *)&local_120,0xff,0xff,0xff,0xff);
  TRM::Bitmap::ClearWithColor(pBVar2,(Color *)&local_120);
  FTOutline::FTOutline(&local_120);
  lVar4 = (long)local_120.ft.n_points;
  local_120.ft.points[lVar4].x = 0x280;
  local_120.ft.points[lVar4].y = 0x280;
  local_120.ft.tags[lVar4] = '\x01';
  if (local_120.ft.n_points != 0) {
    local_120.ft.contours[local_120.ft.n_contours] = local_120.ft.n_points + -1;
    local_120.ft.n_contours = local_120.ft.n_contours + 1;
  }
  local_120.ft.contours_flag[local_120.ft.n_contours] = '\x01';
  sVar3 = local_120.ft.n_points + 1;
  local_120.ft.points[sVar3].x = 0x2800;
  local_120.ft.points[sVar3].y = 0x280;
  local_120.ft.tags[sVar3] = '\0';
  sVar3 = local_120.ft.n_points + 2;
  local_120.ft.points[sVar3].x = 0x2800;
  local_120.ft.points[sVar3].y = 0x2800;
  local_120.ft.tags[sVar3] = '\x01';
  sVar3 = local_120.ft.n_points + 3;
  local_120.ft.points[sVar3].x = 0x280;
  local_120.ft.points[sVar3].y = 0x280;
  local_120.ft.tags[sVar3] = '\x01';
  if ((short)(local_120.ft.n_points + 4) != 0) {
    local_120.ft.contours[local_120.ft.n_contours] = sVar3;
    local_120.ft.n_contours = local_120.ft.n_contours + 1;
  }
  local_120.ft.n_points = local_120.ft.n_points + 4;
  local_148 = (short *)0x0;
  psStack_140 = (short *)0x0;
  local_138 = 0;
  local_78.flags = 3;
  local_78.gray_spans = ft_raster_generation_cb;
  local_78.bbox_cb = ft_bbox_cb;
  local_78.source = &local_120;
  local_78.user = &local_148;
  gray_raster_render((gray_PRaster)0x0,&local_78);
  local_88 = psStack_140;
  if (local_148 != psStack_140) {
    psVar6 = local_148;
    do {
      if (psVar6[2] != 0) {
        sVar3 = *psVar6;
        sVar1 = psVar6[1];
        uVar5 = 0;
        do {
          pBVar2 = local_130;
          TRM::Color::Color(&local_7c,'\0','\0','\0',(uint8_t)psVar6[3]);
          TRM::Bitmap::BlendPixel(pBVar2,uVar5 + (int)sVar3,(int)sVar1,&local_7c);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ushort)psVar6[2]);
      }
      psVar6 = psVar6 + 4;
    } while (psVar6 != local_88);
  }
  TRM::Bitmap::WriteToPng(local_130,"ft_raster_test.png");
  if (local_148 != (short *)0x0) {
    operator_delete(local_148,local_138 - (long)local_148);
  }
  if (local_120.m_counter_flags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.m_counter_flags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.m_counter_flags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.m_counter_flags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_120.m_contours.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.m_contours.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.m_contours.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.m_contours.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_120.m_tags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.m_tags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.m_tags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.m_tags.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_120.m_points.super__Vector_base<SW_FT_Vector_,_std::allocator<SW_FT_Vector_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.m_points.
                    super__Vector_base<SW_FT_Vector_,_std::allocator<SW_FT_Vector_>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.m_points.
                          super__Vector_base<SW_FT_Vector_,_std::allocator<SW_FT_Vector_>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.m_points.
                          super__Vector_base<SW_FT_Vector_,_std::allocator<SW_FT_Vector_>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_128._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128._M_pi);
  }
  return 0;
}

Assistant:

int main(int argc, const char** argv) {
  std::shared_ptr<TRM::Bitmap> framebuffer =
      std::make_shared<TRM::Bitmap>(WIDTH, HEIGHT);

  framebuffer->ClearWithColor(TRM::Color(255, 255, 255, 255));

  FTOutline outline;

  outline.move_to(10, 10);
  outline.quad_to(160, 10, 160, 160);
  outline.line_to(10, 10);

  outline.end();

  SpanHolder holder;

  SW_FT_Raster_Params params;
  params.flags = SW_FT_RASTER_FLAG_DIRECT | SW_FT_RASTER_FLAG_AA;
  params.gray_spans = &ft_raster_generation_cb;
  params.bbox_cb = &ft_bbox_cb;
  params.user = &holder;
  params.source = &outline.ft;

  sw_ft_grays_raster.raster_render(nullptr, &params);

  for (auto const& span : holder.spans) {
    int32_t x = span.x;
    int32_t y = span.y;
    for (int32_t i = 0; i < span.len; i++) {
      framebuffer->BlendPixel(x + i, y, TRM::Color(0, 0, 0, span.coverage));
    }
  }

  framebuffer->WriteToPng("ft_raster_test.png");
  return 0;
}